

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void get_loc_or_ref(DynBuf *bc,BOOL is_ref,int idx)

{
  undefined8 in_RAX;
  uint8_t c;
  undefined8 uStack_18;
  
  c = '^';
  if (is_ref == 0) {
    c = 'X';
  }
  uStack_18 = in_RAX;
  dbuf_putc(bc,c);
  uStack_18 = CONCAT26((short)idx,(undefined6)uStack_18);
  dbuf_put(bc,(uint8_t *)((long)&uStack_18 + 6),2);
  return;
}

Assistant:

static void get_loc_or_ref(DynBuf *bc, BOOL is_ref, int idx)
{
    /* if the field is not initialized, the error is catched when
       accessing it */
    if (is_ref) 
        dbuf_putc(bc, OP_get_var_ref);
    else
        dbuf_putc(bc, OP_get_loc);
    dbuf_put_u16(bc, idx);
}